

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O3

void __thiscall amrex::StateData::replaceOldData(StateData *this,MultiFab *mf)

{
  MultiFab *pMVar1;
  MultiFab *this_00;
  
  this_00 = (MultiFab *)operator_new(0x180);
  MultiFab::MultiFab(this_00,mf);
  pMVar1 = (this->old_data)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
           super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
  (this->old_data)._M_t.
  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = this_00;
  if (pMVar1 != (MultiFab *)0x0) {
    (**(code **)(*(long *)&(pMVar1->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8))();
    return;
  }
  return;
}

Assistant:

void
StateData::replaceOldData (MultiFab&& mf)
{
    old_data = std::make_unique<MultiFab>(std::move(mf));
}